

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Input::mapTag(Input *this,StringRef Tag,bool Default)

{
  StringRef RHS;
  undefined1 local_48 [8];
  string foundTag;
  StringRef Tag_local;
  
  foundTag.field_2._8_8_ = Tag.Data;
  if (this->CurrentNode == (HNode *)0x0) {
    Default = false;
  }
  else {
    Node::getVerbatimTag_abi_cxx11_((string *)local_48,this->CurrentNode->_node);
    if (foundTag._M_dataplus._M_p != (pointer)0x0) {
      RHS.Length = (size_t)foundTag._M_dataplus._M_p;
      RHS.Data = (char *)local_48;
      Default = StringRef::equals((StringRef *)((long)&foundTag.field_2 + 8),RHS);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return Default;
}

Assistant:

bool Input::mapTag(StringRef Tag, bool Default) {
  // CurrentNode can be null if setCurrentDocument() was unable to
  // parse the document because it was invalid or empty.
  if (!CurrentNode)
    return false;

  std::string foundTag = CurrentNode->_node->getVerbatimTag();
  if (foundTag.empty()) {
    // If no tag found and 'Tag' is the default, say it was found.
    return Default;
  }
  // Return true iff found tag matches supplied tag.
  return Tag.equals(foundTag);
}